

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O0

void highbd_h_predictor(uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,
                       int bd)

{
  int in_ECX;
  int in_EDX;
  long in_RSI;
  void *in_RDI;
  long in_R9;
  int r;
  undefined4 local_2c;
  undefined8 local_8;
  
  local_8 = in_RDI;
  for (local_2c = 0; local_2c < in_ECX; local_2c = local_2c + 1) {
    aom_memset16(local_8,(uint)*(ushort *)(in_R9 + (long)local_2c * 2),(long)in_EDX);
    local_8 = (void *)(in_RSI * 2 + (long)local_8);
  }
  return;
}

Assistant:

static inline void highbd_h_predictor(uint16_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint16_t *above,
                                      const uint16_t *left, int bd) {
  int r;
  (void)above;
  (void)bd;
  for (r = 0; r < bh; r++) {
    aom_memset16(dst, left[r], bw);
    dst += stride;
  }
}